

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O2

void __thiscall
anurbs::PolylineMapper<3L>::PolylineMapper
          (PolylineMapper<3L> *this,
          vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
          *points)

{
  RTree<3L> *this_00;
  double *pdVar1;
  pointer pMVar2;
  Index i;
  long lVar3;
  long lVar4;
  Vector local_88;
  Vector local_68;
  Vector box_b;
  
  std::
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ::vector(&this->m_points,points);
  this_00 = &this->m_rtree;
  RTree<3L>::RTree(this_00,((long)(points->
                                  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(points->
                                 super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0x18 + -1,0x10);
  lVar3 = 1;
  lVar4 = 0;
  while( true ) {
    pMVar2 = (points->
             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(points->
               super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x18 <= lVar3) break;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                    .m_data + lVar4 + 0x10);
    pdVar1 = (double *)
             ((long)&pMVar2[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data + lVar4);
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = *pdVar1;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = pdVar1[1];
    pdVar1 = (double *)
             ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data + lVar4);
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = *pdVar1;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = pdVar1[1];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage
                    .m_data + lVar4 + 0x10);
    box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
         local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
         array[0];
    box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
         local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
         array[1];
    box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
         local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
         array[2];
    RTree<3L>::add(this_00,&local_68,&local_88);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  RTree<3L>::finish(this_00,false);
  return;
}

Assistant:

PolylineMapper(const std::vector<Vector>& points)
    : m_points(points)
    , m_rtree(length(points) - 1)
    {
        for (Index i = 1; i < length(points); i++) {
            Vector box_a = points[i - 1];
            Vector box_b = points[i];

            m_rtree.add(box_a, box_b);
        }

        m_rtree.finish(false);
    }